

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.cxx
# Opt level: O0

double glauber::anon_unknown_0::compute_cross_sec_param(VarMap *var_map)

{
  anon_class_16_2_de34cd2f f;
  double *pdVar1;
  variable_value *ax;
  double *in_RDI;
  pair<double,_double> pVar2;
  domain_error *anon_var_0;
  pair<double,_double> result;
  double c;
  double rhs;
  uintmax_t max_iter;
  eps_tolerance<double> tol;
  double b;
  double a;
  double width;
  double sigma_nn;
  string *in_stack_fffffffffffffeb8;
  variables_map *in_stack_fffffffffffffec0;
  double dVar3;
  undefined8 in_stack_fffffffffffffec8;
  uint bits;
  eps_tolerance<double> *in_stack_fffffffffffffed0;
  uintmax_t *in_stack_fffffffffffffed8;
  eps_tolerance<double> tol_00;
  allocator *paVar4;
  allocator local_71;
  string local_70 [32];
  double local_50;
  allocator local_31;
  string local_30 [32];
  double local_10;
  double *local_8;
  
  bits = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"cross-section",&local_31);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  pdVar1 = boost::program_options::variable_value::as<double>((variable_value *)0x17488c);
  tol_00.eps = *pdVar1;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  paVar4 = &local_71;
  local_10 = tol_00.eps;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"nucleon-width",paVar4);
  ax = boost::program_options::variables_map::operator[]
                 (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  pdVar1 = boost::program_options::variable_value::as<double>((variable_value *)0x174928);
  dVar3 = *pdVar1;
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_50 = dVar3;
  boost::math::tools::eps_tolerance<double>::eps_tolerance(in_stack_fffffffffffffed0,bits);
  sqr<double>(local_50);
  sqr<double>(6.0);
  f.c = (double *)paVar4;
  f.rhs = local_8;
  pVar2 = boost::math::tools::
          toms748_solve<glauber::(anonymous_namespace)::compute_cross_sec_param(boost::program_options::variables_map_const&)::__0,double,boost::math::tools::eps_tolerance<double>>
                    (f,(double *)ax,pdVar1,tol_00,in_stack_fffffffffffffed8);
  return (pVar2.first + pVar2.second) * 0.5;
}

Assistant:

double compute_cross_sec_param(const VarMap& var_map) {
  // Read parameters from the configuration.
  auto sigma_nn = var_map["cross-section"].as<double>();
  auto width = var_map["nucleon-width"].as<double>();

  // TODO: automatically set from beam energy
  // if (sigma_nn < 0.) {
  //   auto sqrt_s = var_map["beam-energy"].as<double>();
  // }

  // Initialize arguments for boost root finding function.

  // Bracket min and max.
  auto a = -10.;
  auto b = 20.;

  // Tolerance function.
  // Require 3/4 of double precision.
  math::tools::eps_tolerance<double> tol{
    (std::numeric_limits<double>::digits * 3) / 4};

  // Maximum iterations.
  // This is overkill -- in testing only 10-20 iterations were required
  // (but no harm in overestimating).
  boost::uintmax_t max_iter = 1000;

  // The right-hand side of the equation.
  auto rhs = sigma_nn / (4 * math::double_constants::pi * sqr(width));

  // This quantity appears a couple times in the equation.
  auto c = sqr(max_impact_widths) / 4;

  try {
    auto result = math::tools::toms748_solve(
      [&rhs, &c](double x) {
        using std::exp;
        using math::expint;
        return c - expint(-exp(x)) + expint(-exp(x-c)) - rhs;
      },
      a, b, tol, max_iter);

    return .5*(result.first + result.second);
  }
  catch (const std::domain_error&) {
    // Root finding fails for very small nucleon widths, w^2/sigma_nn < ~0.01.
    throw std::domain_error{
      "unable to fit cross section -- nucleon width too small?"};
  }
}